

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnintf.c
# Opt level: O1

UINT8 get_ssg_funcs(DEV_DEF *devDef,ssg_callbacks *retFuncs)

{
  UINT8 UVar1;
  
  UVar1 = SndEmu_GetDeviceFunc(devDef,'\0','\x11',0,&retFuncs->write);
  if (UVar1 == '\0') {
    UVar1 = SndEmu_GetDeviceFunc(devDef,'\x01','\x11',0,&retFuncs->read);
    if (UVar1 == '\0') {
      UVar1 = SndEmu_GetDeviceFunc(devDef,0x80,'\0',0,&retFuncs->set_clock);
      if (UVar1 == '\0') {
        if (devDef->Reset == (DEVFUNC_CTRL)0x0) {
          UVar1 = 0xff;
        }
        else {
          retFuncs->reset = devDef->Reset;
          UVar1 = '\0';
        }
      }
    }
  }
  return UVar1;
}

Assistant:

static UINT8 get_ssg_funcs(const DEV_DEF* devDef, ssg_callbacks* retFuncs)
{
	UINT8 retVal;
	
	retVal = SndEmu_GetDeviceFunc(devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&retFuncs->write);
	if (retVal)
		return retVal;
	retVal = SndEmu_GetDeviceFunc(devDef, RWF_REGISTER | RWF_READ, DEVRW_A8D8, 0, (void**)&retFuncs->read);
	if (retVal)
		return retVal;
	retVal = SndEmu_GetDeviceFunc(devDef, RWF_CLOCK | RWF_WRITE, DEVRW_VALUE, 0, (void**)&retFuncs->set_clock);
	if (retVal)
		return retVal;
	
	if (devDef->Reset == NULL)
		return 0xFF;
	retFuncs->reset = devDef->Reset;
	return 0x00;
}